

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O2

void __thiscall Clasp::Solver::removeWatch(Solver *this,Literal *p,ClauseHead *h)

{
  bool bVar1;
  uint uVar2;
  ClauseWatch *it;
  left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch> *this_00;
  
  uVar2 = p->rep_ >> 1;
  if ((this->watches_).ebo_.size <= uVar2) {
    return;
  }
  this_00 = (left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch> *)
            ((this->watches_).ebo_.buf + uVar2);
  if ((this->lazyRem_ != (Dirty *)0x0) &&
     (bVar1 = Dirty::add(this->lazyRem_,(Literal)p->rep_,(WatchList *)this_00,h), bVar1)) {
    return;
  }
  it = std::__find_if<Clasp::ClauseWatch*,__gnu_cxx::__ops::_Iter_pred<Clasp::ClauseWatch::EqHead>>
                 (this_00->buf_,this_00->buf_ + this_00->left_,h);
  bk_lib::detail::left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>::erase_left(this_00,it);
  return;
}

Assistant:

void Solver::removeWatch(const Literal& p, ClauseHead* h) {
	if (!validWatch(p)) { return; }
	WatchList& pList = watches_[p.id()];
	if (!lazyRem_ || !lazyRem_->add(p, pList, h)) {
		pList.erase_left(std::find_if(pList.left_begin(), pList.left_end(), ClauseWatch::EqHead(h)));
	}
}